

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined7 uVar6;
  ulong uVar5;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  bool verbose;
  bool tabular;
  allocator local_75;
  undefined4 local_74;
  uint32_t local_70;
  uint local_6c;
  string local_68;
  longlong local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = 0;
  local_6c = 0;
  uVar10 = 0;
  local_40 = 100000;
  local_48 = 1;
  do {
    while (iVar3 = getopt(argc,argv,"vhtm:n:i:"), iVar3 == 0x69) {
      iVar3 = atoi(_optarg);
      uVar10 = (ulong)iVar3;
    }
    uVar6 = (undefined7)
            ((ulong)((long)&switchD_0011bb0f::switchdataD_00122440 +
                    (long)(int)(&switchD_0011bb0f::switchdataD_00122440)[iVar3 - 0x6d]) >> 8);
    switch(iVar3) {
    case 0x6d:
      local_48 = atoll(_optarg);
      break;
    case 0x6e:
      local_40 = atoll(_optarg);
      break;
    case 0x74:
      local_38 = CONCAT71(uVar6,1);
      break;
    case 0x76:
      local_6c = (uint)CONCAT71(uVar6,1);
      break;
    default:
      if (iVar3 == -1) {
        uVar7 = local_40;
        if (local_40 >> 0x20 != 0) {
          printf("setting n to %u \n",0xffffffff);
          uVar7 = 0xffffffff;
        }
        uVar1 = local_38;
        if (uVar10 >> 0x20 == 0) {
          uVar5 = uVar7 * local_48;
          local_70 = 10;
          if (uVar5 < 1000000) {
            local_70 = 100;
          }
          if (uVar10 != 0) {
            local_70 = (uint32_t)uVar10;
          }
        }
        else {
          local_70 = 0xffffffff;
          uVar4 = printf("setting iterations to %u \n",0xffffffff);
          uVar5 = (ulong)uVar4;
        }
        if (uVar7 == 0) {
          puts("n cannot be zero.");
          iVar3 = 1;
        }
        else {
          if ((uVar1 & 1) == 0) {
            if ((local_6c & 1) == 0) {
              local_74 = (undefined4)CONCAT71((int7)(uVar5 >> 8),1);
              local_6c = 0;
            }
            else {
              local_74 = 0;
              iVar3 = printf("%-40s\t","memcpy-8");
              local_6c = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
            }
          }
          else {
            iVar3 = puts(
                        "Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs"
                        );
            local_74 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          }
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"memcpy-8","");
          uVar4 = (uint)uVar1 & 1;
          verbose = (bool)((byte)local_6c & 1);
          benchmarkMemoryCopy(&local_68,(uint32_t)uVar7,(uint32_t)local_48,local_70,verbose,
                              SUB41(uVar4,0));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((char)local_74 == '\0') {
            printf("%-40s\t","memcpy-16");
          }
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"memcpy-16","");
          benchmarkMemoryCopy(&local_68,(uint32_t)uVar7 * 2,(uint32_t)local_48,local_70,verbose,
                              SUB41(uVar4,0));
          local_40 = uVar7;
          local_38 = (ulong)uVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar9));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u16_method_names + lVar9);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                  *(pospopcnt_u16_method_type *)
                                   ((long)pospopcnt_u16_methods + lVar9),verbose,true,
                                  SUB81(local_38,0));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            uVar10 = local_38;
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x38);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar9 + 0x38));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u16_method_names + lVar9 + 0x38);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            tabular = SUB81(uVar10,0);
            bVar2 = benchmarkMany(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                  *(pospopcnt_u16_method_type *)
                                   ((long)pospopcnt_u16_sse_methods + lVar9),verbose,true,tabular);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x38);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar9 + 0x70));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u16_method_names + lVar9 + 0x70);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                  *(pospopcnt_u16_method_type *)
                                   ((long)pospopcnt_u16_avx2_methods + lVar9),verbose,true,tabular);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x60);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u16_method_names + lVar9 + 0xd0));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u16_method_names + lVar9 + 0xd0);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                  *(pospopcnt_u16_method_type *)
                                   ((long)pospopcnt_u16_avx512_methods + lVar9),verbose,true,tabular
                                 );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x60);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar9 + 8));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u8_method_names + lVar9 + 8);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany8(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                   *(pospopcnt_u8_method_type *)((long)pospopcnt_u8_methods + lVar9)
                                   ,verbose,true,tabular);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x30);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar9 + 0x38));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u8_method_names + lVar9 + 0x38);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany8(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                   *(pospopcnt_u8_method_type *)
                                    ((long)pospopcnt_u8_sse_methods + lVar9),verbose,true,tabular);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x40);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar9 + 0x78));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u8_method_names + lVar9 + 0x78);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany8(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                   *(pospopcnt_u8_method_type *)
                                    ((long)pospopcnt_u8_avx2_methods + lVar9),verbose,true,tabular);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x68);
          lVar9 = 0;
          do {
            if ((char)local_74 == '\0') {
              printf("%-40s\t",*(undefined8 *)((long)pospopcnt_u8_method_names + lVar9 + 0xe0));
            }
            fflush((FILE *)0x0);
            pcVar8 = *(char **)((long)pospopcnt_u8_method_names + lVar9 + 0xe0);
            std::__cxx11::string::string((string *)&local_68,pcVar8,&local_75);
            bVar2 = benchmarkMany8(&local_68,(uint32_t)local_40,(uint32_t)local_48,local_70,
                                   *(pospopcnt_u8_method_type *)
                                    ((long)pospopcnt_u8_avx512_methods + lVar9),verbose,true,tabular
                                  );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (!bVar2) {
              printf("Problem detected with %s.\n",pcVar8);
            }
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x68);
          iVar3 = 0;
          if ((local_6c & 1) == 0) {
            pcVar8 = "Try -v to get more details.";
LAB_0011c318:
            iVar3 = 0;
            puts(pcVar8);
          }
        }
        return iVar3;
      }
      if (iVar3 == 0x68) {
        printf(" Try %s -n 100000 -i 15 -v \n",*argv);
        puts("-n is the number of 16-bit words ");
        puts("-i is the number of tests or iterations ");
        pcVar8 = "-v makes things verbose";
        goto LAB_0011c318;
      }
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
      abort();
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    bool tabular = false;
    int c;

    while ((c = getopt(argc, argv, "vhtm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 't':
            tabular = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    // printf("n = %zu m = %zu \n", n, m);
    // printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    // if(array_in_bytes < 1024) {
    //   printf("array size: %zu B\n", array_in_bytes);
    // } else if (array_in_bytes < 1024 * 1024) {
    //   printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    // } else {
    //   printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    // }

// #if POSPOPCNT_SIMD_VERSION >= 5
//     measurepopcnt(n*m, iterations, verbose);
// #endif
//     measureoverhead(n*m, iterations, verbose);
    
    if (tabular)
        printf("Method\tSz\tIt\tI/c\tC/w\tI/w\tCycles\tInstructions\tBMiss\tCRef\tCMiss\tTime\tMBs\n");

    if (verbose && !tabular) printf("%-40s\t", "memcpy-8");
    benchmarkMemoryCopy("memcpy-8", n, m, iterations, verbose, tabular);
    if (verbose && !tabular) printf("%-40s\t", "memcpy-16");
    benchmarkMemoryCopy("memcpy-16", 2*n, m, iterations, verbose, tabular);

    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[k], n, m, iterations, pospopcnt_u16_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        // if (verbose) printf("\n");
    }
#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 7; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[7+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[7+k], n, m, iterations, pospopcnt_u16_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[7+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[14+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[14+k], n, m, iterations, pospopcnt_u16_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[14+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 12; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u16_method_names[26+k]);
        fflush(NULL);
        bool isok = benchmarkMany(pospopcnt_u16_method_names[26+k], n, m, iterations, pospopcnt_u16_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[26+k]);
        }
        // if (verbose) printf("\n");
    }
#endif

    for (size_t k = 0; k < 6; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1], n, m, iterations, pospopcnt_u8_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1]);
        }
        // if (verbose) printf("\n");
    }

#if POSPOPCNT_SIMD_VERSION >= 3
    for (size_t k = 0; k < 8; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6], n, m, iterations, pospopcnt_u8_sse_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 5
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8], n, m, iterations, pospopcnt_u8_avx2_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8]);
        }
        // if (verbose) printf("\n");
    }
#endif

#if POSPOPCNT_SIMD_VERSION >= 6
    for (size_t k = 0; k < 13; k++) {
        if (verbose && !tabular) printf("%-40s\t", pospopcnt_u8_method_names[k+1+6+8+13]);
        fflush(NULL);
        bool isok = benchmarkMany8(pospopcnt_u8_method_names[k+1+6+8+13], n, m, iterations, pospopcnt_u8_avx512_methods[k], verbose, true, tabular);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u8_method_names[k+1+6+8+13]);
        }
        // if (verbose) printf("\n");
    }
#endif

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}